

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t roaring_bitmap_get_cardinality(roaring_bitmap_t *r)

{
  int iVar1;
  uint64_t uVar2;
  int i;
  long lVar3;
  
  uVar2 = 0;
  for (lVar3 = 0; lVar3 < (r->high_low_container).size; lVar3 = lVar3 + 1) {
    iVar1 = container_get_cardinality
                      ((r->high_low_container).containers[lVar3],
                       (r->high_low_container).typecodes[lVar3]);
    uVar2 = uVar2 + (long)iVar1;
  }
  return uVar2;
}

Assistant:

uint64_t roaring_bitmap_get_cardinality(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    uint64_t card = 0;
    for (int i = 0; i < ra->size; ++i)
        card += container_get_cardinality(ra->containers[i], ra->typecodes[i]);
    return card;
}